

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<unsigned_char,char>(void)

{
  bool bVar1;
  uint7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = ::operator!=('\0',(SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                             )0x0);
  uVar2 = false;
  if (bVar1) {
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (int *)(ulong)in_stack_ffffffffffffffc8);
    bVar1 = ::operator!=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          )0x0,'\0');
    uVar2 = false;
    if (bVar1) {
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int *)(ulong)in_stack_ffffffffffffffc8);
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
      bVar1 = ::operator!=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            )0x0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                                  )0x0);
      uVar2 = false;
      if (bVar1) {
        SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (int *)(ulong)in_stack_ffffffffffffffc8);
        bVar1 = ::operator!=(false,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                                    )0x0);
        uVar2 = false;
        if (bVar1) {
          SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                     )((ulong)in_stack_ffffffffffffffd4 << 0x20),
                     (int *)(ulong)in_stack_ffffffffffffffc8);
          uVar2 = ::operator!=(false,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                                      )0x0);
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}